

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.cpp
# Opt level: O3

void * Memory::InlineCacheFreeListPolicy::Allocate(void *policy,size_t size)

{
  void *pvVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  if (policy == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/ArenaAllocator.cpp"
                       ,0x412,"(policy)","policy");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pvVar1 = *(void **)((long)policy + (size >> 5) * 8 + -8);
  if (pvVar1 != (void *)0x0) {
    *(ulong *)((long)policy + (size >> 5) * 8 + -8) =
         *(ulong *)((long)pvVar1 + 0x18) & 0xfffffffffffffffe;
    *(undefined8 *)((long)pvVar1 + 0x18) = 0xfefefefefefefefe;
  }
  return pvVar1;
}

Assistant:

void * InlineCacheFreeListPolicy::Allocate(void * policy, size_t size)
{
    Assert(policy);

    FreeObject ** freeObjectLists = reinterpret_cast<FreeObject **>(policy);
    size_t index = (size >> InlineCacheAllocatorInfo::ObjectAlignmentBitShift) - 1;
    FreeObject * freeObject = freeObjectLists[index];

    if (NULL != freeObject)
    {
        freeObjectLists[index] = reinterpret_cast<FreeObject *>(reinterpret_cast<intptr_t>(freeObject->next) & ~InlineCacheFreeListTag);

#ifdef ARENA_MEMORY_VERIFY
        // Make sure the next pointer bytes are also DbgFreeMemFill-ed, before we give them out.
        memset(&freeObject->next, DbgFreeMemFill, sizeof(freeObject->next));
#endif
    }

    return freeObject;
}